

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

void __thiscall iqnet::ssl::exception::exception(exception *this,unsigned_long err)

{
  char *__s;
  allocator<char> local_9;
  
  *(undefined ***)this = &PTR__exception_0018a948;
  this->ssl_err = err;
  __s = ERR_reason_error_string(err);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->msg,__s,&local_9);
  std::__cxx11::string::replace((ulong)&this->msg,0,(char *)0x0,0x171df2);
  return;
}

Assistant:

exception::exception( unsigned long err ) throw():
  ssl_err(err),
  msg( ERR_reason_error_string(ssl_err) )
{
  msg.insert(0, "SSL: ");
}